

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O0

void axl::sl::shlBitMap(size_t *map,size_t pageCount,size_t n)

{
  sbyte sVar1;
  ulong uVar2;
  ulong in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t *prev;
  size_t *src;
  size_t *dst;
  size_t c;
  size_t i;
  ulong *local_40;
  ulong *local_38;
  ulong *local_30;
  
  if (in_RDX != 0) {
    uVar2 = in_RDX >> 6;
    if (uVar2 < in_RSI) {
      if ((in_RDX & 0x3f) == 0) {
        memmove(in_RDI + uVar2,in_RDI,(in_RSI - uVar2) * 8);
        memset(in_RDI,0,uVar2 << 3);
      }
      else {
        sVar1 = (sbyte)(in_RDX & 0x3f);
        local_38 = in_RDI + (in_RSI - 1) + -uVar2;
        local_30 = in_RDI + (in_RSI - 1);
        while (local_40 = local_38 + -1, in_RDI <= local_40) {
          *local_30 = *local_38 << sVar1 | *local_40 >> (0x40U - sVar1 & 0x3f);
          local_30 = local_30 + -1;
          local_38 = local_40;
        }
        *local_30 = *local_38 << sVar1;
        if (uVar2 != 0) {
          memset(in_RDI,0,uVar2 << 3);
        }
      }
    }
    else {
      memset(in_RDI,0,in_RSI << 3);
    }
  }
  return;
}

Assistant:

void
shlBitMap(
	size_t* map,
	size_t pageCount,
	size_t n
) {
	if (!n)
		return;

	size_t i = n / AXL_PTR_BITS;
	if (i >= pageCount) {
		memset(map, 0, pageCount * sizeof(size_t));
		return;
	}

	n &= AXL_PTR_BITS - 1;
	if (!n) {
		memmove(map + i, map, (pageCount - i) * sizeof(size_t));
		memset(map, 0, i * sizeof(size_t));
		return;
	}

	size_t c = AXL_PTR_BITS - n;
	size_t* dst = map + pageCount - 1;
	size_t* src = dst - i;
	size_t* prev = src - 1;
	while (prev >= map) {
		*dst-- = (*src << n) | (*prev >> c);
		src = prev--;
	}

	*dst = *src << n;

	if (i)
		memset(map, 0, i * sizeof(size_t));
}